

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeRboCase::testDepthAttachment
          (UnspecifiedAttachmentSizeRboCase *this)

{
  CallLogWrapper *this_00;
  uint in_EAX;
  int s;
  ulong uStack_28;
  GLuint renderbufferID;
  
  uStack_28 = (ulong)in_EAX;
  this_00 = &(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,renderbufferID);
  s = 0x633279;
  ApiCase::expectError((ApiCase *)this,0);
  checkAttachmentComponentSizeExactly
            ((this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase
             .super_TestNode.m_testCtx,this_00,0x8d00,0,0,0,0,0,0,s);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  return;
}

Assistant:

void testDepthAttachment (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkAttachmentComponentSizeExactly	(m_testCtx, *this, GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0);
		glDeleteRenderbuffers(1, &renderbufferID);
	}